

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
* __thiscall
phmap::priv::btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
insert_hint_unique<int*>
          (pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
           *__return_storage_ptr__,
          btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>> *this,
          iterator position,key_type *key,int **args)

{
  template_ElementType<2UL> *ptVar1;
  uint uVar2;
  btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>> *this_00;
  ulong uVar3;
  long lVar4;
  iterator iVar5;
  iterator prev;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_58;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_48;
  
  this_00 = (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
             *)position.node;
  uVar2 = position.position;
  local_58.node =
       (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
        *)this_00;
  local_58.position = uVar2;
  if (*(long *)(this + 0x10) == 0) {
LAB_0027eeaa:
    insert_unique<int*>(__return_storage_ptr__,this,key,args);
  }
  else {
    iVar5 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
            ::end((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                   *)this);
    if ((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>> *)
        iVar5.node == this_00 && iVar5.position == uVar2) {
LAB_0027edfd:
      local_48._12_4_ = local_58._12_4_;
      local_48.position = local_58.position;
      local_48.node = local_58.node;
      iVar5 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
              ::begin((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                       *)this);
      if ((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>> *
          )iVar5.node != this_00 || iVar5.position != uVar2) {
        btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
        ::decrement(&local_48);
        lVar4 = (long)local_48.position;
        ptVar1 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                 ::GetField<2ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                                  *)local_48.node);
        if (*key <= ptVar1[lVar4]) goto LAB_0027eeaa;
      }
      uVar3 = (ulong)uVar2;
    }
    else {
      ptVar1 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
               ::GetField<2ul>(this_00);
      if (*key < ptVar1[(int)uVar2]) goto LAB_0027edfd;
      ptVar1 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
               ::GetField<2ul>(this_00);
      if (*key <= ptVar1[(int)uVar2]) {
        (__return_storage_ptr__->first).node = local_58.node;
        *(ulong *)&(__return_storage_ptr__->first).position =
             CONCAT44(local_58._12_4_,local_58.position);
        __return_storage_ptr__->second = false;
        return __return_storage_ptr__;
      }
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
      ::increment(&local_58);
      iVar5 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
              ::end((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                     *)this);
      uVar3 = iVar5._8_8_;
      this_00 = (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                 *)local_58.node;
      if (local_58.node != iVar5.node || local_58.position != iVar5.position) {
        lVar4 = (long)local_58.position;
        ptVar1 = btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                 ::GetField<2ul>((btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                                  *)local_58.node);
        if (ptVar1[lVar4] <= *key) goto LAB_0027eeaa;
        uVar3 = (ulong)(uint)local_58.position;
        this_00 = (btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                   *)local_58.node;
      }
    }
    iVar5._8_8_ = uVar3;
    iVar5.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                  *)this_00;
    iVar5 = internal_emplace<int*>(this,iVar5,args);
    (__return_storage_ptr__->first).node = iVar5.node;
    (__return_storage_ptr__->first).position = iVar5.position;
    __return_storage_ptr__->second = true;
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto btree<P>::insert_hint_unique(iterator position, const key_type &key,
                                             Args &&... args)
        -> std::pair<iterator, bool> {
        if (!empty()) {
            if (position == end() || compare_keys(key, position.key())) {
                iterator prev = position;
                if (position == begin() || compare_keys((--prev).key(), key)) {
                    // prev.key() < key < position.key()
                    return {internal_emplace(position, std::forward<Args>(args)...), true};
                }
            } else if (compare_keys(position.key(), key)) {
                ++position;
                if (position == end() || compare_keys(key, position.key())) {
                    // {original `position`}.key() < key < {current `position`}.key()
                    return {internal_emplace(position, std::forward<Args>(args)...), true};
                }
            } else {
                // position.key() == key
                return {position, false};
            }
        }
        return insert_unique(key, std::forward<Args>(args)...);
    }